

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::WaitScope::cancelAllDetached(WaitScope *this)

{
  bool bVar1;
  Fault local_48;
  Fault f;
  undefined1 local_38 [8];
  DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> _kjCondition;
  WaitScope *this_local;
  
  _kjCondition._32_8_ = this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->fiber);
  kj::_::DebugExpression<kj::Maybe<kj::_::FiberBase&>&>::operator==
            ((DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)local_38,
             (DebugExpression<kj::Maybe<kj::_::FiberBase&>&> *)&f,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::_::FiberBase&>&,kj::None_const&>&,char_const(&)[68]>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x7a8,FAILED,"fiber == kj::none",
               "_kjCondition,\"can\'t call cancelAllDetached() on a fiber WaitScope, only top-level\""
               ,(DebugComparison<kj::Maybe<kj::_::FiberBase_&>_&,_const_kj::None_&> *)local_38,
               (char (*) [68])"can\'t call cancelAllDetached() on a fiber WaitScope, only top-level"
              );
    kj::_::Debug::Fault::fatal(&local_48);
  }
  EventLoop::cancelAllDetached(this->loop);
  return;
}

Assistant:

void WaitScope::cancelAllDetached() {
  KJ_REQUIRE(fiber == kj::none,
      "can't call cancelAllDetached() on a fiber WaitScope, only top-level");

  loop.cancelAllDetached();
}